

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformations.c
# Opt level: O1

void al_transform_coordinates_3d(ALLEGRO_TRANSFORM *trans,float *x,float *y,float *z)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  fVar1 = *x;
  fVar2 = *y;
  fVar3 = *z;
  fVar4 = trans->m[1][1];
  fVar5 = trans->m[0][1];
  fVar6 = trans->m[2][1];
  fVar7 = trans->m[3][1];
  fVar8 = trans->m[1][2];
  fVar9 = trans->m[0][2];
  fVar10 = trans->m[2][2];
  fVar11 = trans->m[3][2];
  *x = trans->m[2][0] * fVar3 + trans->m[0][0] * fVar1 + trans->m[1][0] * fVar2 + trans->m[3][0];
  *y = fVar6 * fVar3 + fVar5 * fVar1 + fVar4 * fVar2 + fVar7;
  *z = fVar3 * fVar10 + fVar1 * fVar9 + fVar2 * fVar8 + fVar11;
  return;
}

Assistant:

void al_transform_coordinates_3d(const ALLEGRO_TRANSFORM *trans,
   float *x, float *y, float *z)
{
   float rx, ry, rz;
   ASSERT(trans);
   ASSERT(x);
   ASSERT(y);
   ASSERT(z);

   #define M(i, j) trans->m[i][j]

   rx = M(0, 0) * *x + M(1, 0) * *y + M(2, 0) * *z + M(3, 0);
   ry = M(0, 1) * *x + M(1, 1) * *y + M(2, 1) * *z + M(3, 1);
   rz = M(0, 2) * *x + M(1, 2) * *y + M(2, 2) * *z + M(3, 2);

   #undef M

   *x = rx;
   *y = ry;
   *z = rz;
}